

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plot.hpp
# Opt level: O3

void __thiscall sciplot::Plot::yrange(Plot *this,double min,double max)

{
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  long *local_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 uStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  string local_b8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  double local_78;
  string local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  double local_30;
  
  local_78 = max;
  local_30 = min;
  internal::str<double>(&local_70,&local_30);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x18d641);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_88 = *plVar3;
    lStack_80 = plVar1[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar3;
    local_98 = (long *)*plVar1;
  }
  local_90 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_98);
  puVar4 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar4) {
    local_c8 = *puVar4;
    lStack_c0 = plVar1[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar4;
    local_d8 = (ulong *)*plVar1;
  }
  local_d0 = plVar1[1];
  *plVar1 = (long)puVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  internal::str<double>(&local_b8,&local_78);
  uVar5 = 0xf;
  if (local_d8 != &local_c8) {
    uVar5 = local_c8;
  }
  if (uVar5 < local_b8._M_string_length + local_d0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar6 = local_b8.field_2._M_allocated_capacity;
    }
    if (local_b8._M_string_length + local_d0 <= (ulong)uVar6) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_d8);
      goto LAB_00168fcc;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8._M_dataplus._M_p);
LAB_00168fcc:
  local_f8 = &local_e8;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_e8 = *plVar1;
    uStack_e0 = puVar2[3];
  }
  else {
    local_e8 = *plVar1;
    local_f8 = (long *)*puVar2;
  }
  local_f0 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_40 = *plVar3;
    lStack_38 = plVar1[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar3;
    local_50 = (long *)*plVar1;
  }
  local_48 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->m_yrange,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline auto Plot::yrange(double min, double max) -> void
{
    m_yrange = "[" + internal::str(min) + ":" + internal::str(max) + "]";
}